

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOOLEAN.c
# Opt level: O0

asn_enc_rval_t *
BOOLEAN_encode_uper(asn_TYPE_descriptor_t *td,asn_per_constraints_t *constraints,void *sptr,
                   asn_per_outp_t *po)

{
  int iVar1;
  asn_per_outp_t *in_RCX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  asn_enc_rval_t *tmp_error;
  asn_enc_rval_t er;
  BOOLEAN_t *st;
  char *local_60;
  char *local_58;
  ssize_t local_40 [2];
  undefined8 in_stack_ffffffffffffffd0;
  asn_per_outp_t *po_00;
  
  po_00 = in_RCX;
  memset(local_40,0,0x18);
  if (po_00 == (asn_per_outp_t *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = in_RCX;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_58 = "";
    }
    else {
      local_58 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_58);
  }
  else {
    iVar1 = per_put_few_bits(po_00,(uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                             (int)in_stack_ffffffffffffffd0);
    if (iVar1 == 0) {
      in_RDI->encoded = local_40[0];
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      in_RDI->structure_ptr = (void *)0x0;
    }
    else {
      in_RDI->encoded = -1;
      in_RDI->failed_type = in_RSI;
      in_RDI->structure_ptr = in_RCX;
      if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
        local_60 = "";
      }
      else {
        local_60 = in_RSI->name;
      }
      ASN_DEBUG("Failed to encode element %s",local_60);
    }
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
BOOLEAN_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	const BOOLEAN_t *st = (const BOOLEAN_t *)sptr;
	asn_enc_rval_t er = { 0, 0, 0 };

	(void)constraints;

	if(!st) ASN__ENCODE_FAILED;

	if(per_put_few_bits(po, *st ? 1 : 0, 1))
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}